

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writePrimalSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,
                        vector<double,_std::allocator<double>_> *primal_solution,bool sparse)

{
  double val;
  ostream *this;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined3 in_register_00000081;
  long lVar4;
  ulong uVar5;
  array<char,_32UL> valStr;
  string name;
  stringstream ss;
  string local_238;
  HighsLogOptions *local_218;
  vector<double,_std::allocator<double>_> *local_210;
  string local_208;
  pointer local_1e8;
  pointer local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  iVar2 = 0;
  if (CONCAT31(in_register_00000081,sparse) != 0) {
    uVar1 = 0;
    uVar5 = (ulong)(uint)lp->num_col_;
    if (lp->num_col_ < 1) {
      uVar5 = uVar1;
    }
    iVar2 = 0;
    for (; uVar5 != uVar1; uVar1 = uVar1 + 1) {
      iVar2 = iVar2 + (uint)((primal_solution->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar1] != 0.0);
    }
  }
  local_1e0 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_218 = log_options;
  local_210 = primal_solution;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_238);
  if (sparse) {
    uVar3 = -iVar2;
  }
  else {
    uVar3 = lp->num_col_;
  }
  highsFormatToString_abi_cxx11_(&local_238,"# Columns %d\n",(ulong)uVar3);
  std::operator<<((ostream *)local_1a8,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::stringbuf::str();
  highsFprintfString(file,local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  lVar4 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)lp->num_col_; uVar5 = uVar5 + 1) {
    val = (local_210->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5];
    if (((!sparse) || (val != 0.0)) || (NAN(val))) {
      highsDoubleToString((array<char,_32UL> *)&local_238,val,1e-13);
      local_1d8 = local_1c8;
      local_1d0 = 0;
      local_1c8[0] = 0;
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      std::__cxx11::string::~string((string *)&local_1d8);
      this = std::operator<<((ostream *)local_1a8,"C");
      std::ostream::operator<<(this,(int)uVar5);
      if (local_1e8 == local_1e0) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_1d8,
                   (string *)
                   ((long)&(((lp->col_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4))
        ;
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      std::__cxx11::string::~string((string *)&local_208);
      highsFormatToString_abi_cxx11_(&local_208,"%-s %s",local_1d8,&local_238);
      std::operator<<((ostream *)local_1a8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      if (sparse) {
        highsFormatToString_abi_cxx11_(&local_208," %d",uVar5 & 0xffffffff);
        std::operator<<((ostream *)local_1a8,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
      }
      std::operator<<((ostream *)local_1a8,"\n");
      std::__cxx11::stringbuf::str();
      highsFprintfString(file,local_218,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    lVar4 = lVar4 + 0x20;
  }
  fflush((FILE *)file);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void writePrimalSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp,
                         const std::vector<double>& primal_solution,
                         const bool sparse) {
  HighsInt num_nonzero_primal_value = 0;
  const bool have_col_names = lp.col_names_.size() > 0;
  if (sparse) {
    // Determine the number of nonzero primal solution values
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      if (primal_solution[iCol]) num_nonzero_primal_value++;
  }
  // Indicate the number of column values to be written out, depending
  // on whether format is sparse: either lp.num_col_ if not sparse, or
  // the negation of the number of nonzero values, if sparse

  std::stringstream ss;
  ss.str(std::string());
  ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n",
                            sparse ? -num_nonzero_primal_value : lp.num_col_);
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
    if (sparse && !primal_solution[ix]) continue;
    auto valStr = highsDoubleToString(primal_solution[ix],
                                      kHighsSolutionValueToStringTolerance);
    // Create a column name
    ss.str(std::string());
    ss << "C" << ix;
    const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
    ss.str(std::string());
    ss << highsFormatToString("%-s %s", name.c_str(), valStr.data());
    if (sparse) ss << highsFormatToString(" %d", int(ix));
    ss << "\n";
    highsFprintfString(file, log_options, ss.str());
  }
  fflush(file);
}